

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::SetForceID(Appearance_PDU *this,ForceID ID)

{
  KUINT16 *pKVar1;
  
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 1) == 0) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 1;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 1;
  }
  this->m_ui8ForceID = (KUINT8)ID;
  return;
}

Assistant:

void Appearance_PDU::SetForceIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8ForceId )return;

    m_AppearanceFlag1Union.m_ui8ForceId = F;

    if( F )
    {
        m_ui16PDULength += 1; // 1 = Size of force id
    }
    else
    {
        m_ui16PDULength -= 1;
    }
}